

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<double>::SolveSOR
          (TPZSkylMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  double dVar2;
  long lVar3;
  double **ppdVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  long local_60;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<double> *)0x0) {
    dVar19 = *tol + *tol + 1.0;
  }
  else {
    dVar19 = Dot<double>(residual,residual);
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar7 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar13 = CONCAT44(extraout_var,iVar7) + -1;
  lVar15 = 0;
  lVar6 = lVar15;
  if (direction != -1) {
    lVar13 = lVar15;
    lVar6 = CONCAT44(extraout_var,iVar7);
  }
  if ((0 < *numiterations) && (*tol <= dVar19 && dVar19 != *tol)) {
    lVar3 = (F->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar1 = (ulong)(direction != -1) * 2 + -1;
    lVar15 = 0;
    do {
      TPZFMatrix<double>::operator=(scratch,F);
      dVar19 = 0.0;
      if (0 < lVar3) {
        local_60 = 0;
        lVar16 = 0;
        do {
          lVar18 = lVar13;
          lVar10 = lVar13 * 8 + 8;
          if (direction == 1) {
            for (; lVar8 = lVar13, lVar18 != lVar6; lVar18 = lVar18 + lVar1) {
              ppdVar4 = (this->fElem).fStore;
              pdVar5 = ppdVar4[lVar18];
              lVar17 = (long)ppdVar4[lVar18 + 1] - (long)pdVar5;
              lVar14 = lVar17 >> 3;
              lVar8 = lVar18 - lVar14;
              if (((lVar8 < -1) ||
                  ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8 + 1)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar11 = scratch->fElem;
              if (((lVar18 < 0) ||
                  ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar9 = (double *)((long)(this->fElem).fStore[lVar18] + lVar17 + -8);
              lVar8 = (long)pdVar9 - (long)pdVar5 >> 3;
              if (-1 < lVar8) {
                dVar20 = result->fElem
                         [(result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 +
                          lVar18];
                lVar17 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_60 +
                         lVar10 + lVar14 * -8;
                lVar14 = 0;
                do {
                  *(double *)((long)pdVar11 + lVar14 * 8 + lVar17) =
                       *(double *)((long)pdVar11 + lVar14 * 8 + lVar17) - *pdVar9 * dVar20;
                  lVar14 = lVar14 + 1;
                  pdVar9 = pdVar9 + -1;
                } while (lVar8 + 1 != lVar14);
              }
              lVar10 = lVar10 + lVar1 * 8;
            }
            for (; lVar8 != lVar6; lVar8 = lVar8 + lVar1) {
              ppdVar4 = (this->fElem).fStore;
              lVar18 = (long)ppdVar4[lVar8 + 1] - (long)ppdVar4[lVar8];
              if (((lVar8 < 0) ||
                  ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar10 = lVar18 >> 3;
              dVar20 = scratch->fElem
                       [(scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 + lVar8
                       ];
              lVar14 = (lVar8 - lVar10) + 1;
              if (((lVar8 - lVar10 < -1) ||
                  ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar10 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              pdVar5 = (this->fElem).fStore[lVar8];
              pdVar11 = (double *)((long)pdVar5 + lVar18 + -8);
              if (pdVar5 < pdVar11) {
                pdVar9 = result->fElem + lVar10 * lVar16 + lVar14;
                do {
                  dVar2 = *pdVar9;
                  pdVar9 = pdVar9 + 1;
                  dVar20 = dVar20 - *pdVar11 * dVar2;
                  pdVar11 = pdVar11 + -1;
                } while (pdVar5 < pdVar11);
              }
              if (((lVar8 < 0) || (lVar10 <= lVar8)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar18 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16;
              dVar19 = dVar19 + ABS(dVar20 * dVar20);
              result->fElem[lVar18 + lVar8] =
                   (dVar20 * overrelax) / *pdVar11 + result->fElem[lVar18 + lVar8];
            }
          }
          else {
            for (; lVar10 = lVar13, lVar18 != lVar6; lVar18 = lVar18 + lVar1) {
              ppdVar4 = (this->fElem).fStore;
              lVar10 = (long)ppdVar4[lVar18 + 1] - (long)ppdVar4[lVar18];
              if (((lVar18 < 0) ||
                  ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar8 = lVar10 >> 3;
              dVar20 = scratch->fElem
                       [(scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 +
                        lVar18];
              lVar14 = (lVar18 - lVar8) + 1;
              if (((lVar18 - lVar8 < -1) ||
                  ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5 = (this->fElem).fStore[lVar18];
              pdVar11 = (double *)((long)pdVar5 + lVar10 + -8);
              if (pdVar5 < pdVar11) {
                pdVar9 = result->fElem +
                         (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 +
                         lVar14;
                do {
                  dVar2 = *pdVar9;
                  pdVar9 = pdVar9 + 1;
                  dVar20 = dVar20 - *pdVar11 * dVar2;
                  pdVar11 = pdVar11 + -1;
                } while (pdVar5 < pdVar11);
              }
              if (((lVar18 < 0) ||
                  ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              scratch->fElem
              [(scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 + lVar18] =
                   dVar20;
            }
            for (; lVar10 != lVar6; lVar10 = lVar10 + lVar1) {
              ppdVar4 = (this->fElem).fStore;
              pdVar5 = ppdVar4[lVar10];
              lVar14 = (long)ppdVar4[lVar10 + 1] - (long)pdVar5;
              lVar18 = lVar14 >> 3;
              lVar8 = (lVar10 - lVar18) + 1;
              if (((lVar10 - lVar18 < -1) ||
                  ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar18 = (scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              pdVar11 = scratch->fElem;
              if (((lVar10 < 0) || (lVar18 <= lVar10)) ||
                 ((scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((lVar10 < 0) ||
                  ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar17 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              dVar20 = scratch->fElem
                       [(scratch->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 +
                        lVar10] - *pdVar5 * result->fElem[lVar17 * lVar16 + lVar10];
              if (((lVar10 < 0) || (lVar17 <= lVar10)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar17 = (result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              lVar12 = lVar17 * lVar16;
              result->fElem[lVar12 + lVar10] =
                   (dVar20 * overrelax) / *pdVar5 + result->fElem[lVar12 + lVar10];
              if (((lVar10 < 0) || (lVar17 <= lVar10)) ||
                 ((result->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar9 = (double *)((long)(this->fElem).fStore[lVar10] + lVar14 + -8);
              if (pdVar5 < pdVar9) {
                pdVar11 = pdVar11 + lVar18 * lVar16 + lVar8;
                dVar2 = result->fElem
                        [(result->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16 +
                         lVar10];
                do {
                  *pdVar11 = *pdVar11 - *pdVar9 * dVar2;
                  pdVar11 = pdVar11 + 1;
                  pdVar9 = pdVar9 + -1;
                } while (pdVar5 < pdVar9);
              }
              dVar19 = dVar19 + ABS(dVar20 * dVar20);
            }
          }
          lVar16 = lVar16 + 1;
          local_60 = local_60 + 8;
        } while (lVar16 != lVar3);
      }
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
      lVar15 = lVar15 + 1;
    } while ((lVar15 < *numiterations) && (*tol <= dVar19 && dVar19 != *tol));
  }
  if (residual != (TPZFMatrix<double> *)0x0) {
    (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x28])
              (this,result,F);
  }
  *numiterations = lVar15;
  *tol = dVar19;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}